

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O0

int mbedtls_chachapoly_starts
              (mbedtls_chachapoly_context *ctx,uchar *nonce,mbedtls_chachapoly_mode_t mode)

{
  uchar local_68 [8];
  uchar poly1305_key [64];
  int local_20;
  int ret;
  mbedtls_chachapoly_mode_t mode_local;
  uchar *nonce_local;
  mbedtls_chachapoly_context *ctx_local;
  
  local_20 = mbedtls_chacha20_starts(&ctx->chacha20_ctx,nonce,0);
  if (local_20 == 0) {
    memset(local_68,0,0x40);
    local_20 = mbedtls_chacha20_update(&ctx->chacha20_ctx,0x40,local_68,local_68);
    if ((local_20 == 0) &&
       (local_20 = mbedtls_poly1305_starts(&ctx->poly1305_ctx,local_68), local_20 == 0)) {
      ctx->aad_len = 0;
      ctx->ciphertext_len = 0;
      ctx->state = 1;
      ctx->mode = mode;
    }
  }
  mbedtls_platform_zeroize(local_68,0x40);
  return local_20;
}

Assistant:

int mbedtls_chachapoly_starts( mbedtls_chachapoly_context *ctx,
                               const unsigned char nonce[12],
                               mbedtls_chachapoly_mode_t mode  )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char poly1305_key[64];
    CHACHAPOLY_VALIDATE_RET( ctx != NULL );
    CHACHAPOLY_VALIDATE_RET( nonce != NULL );

    /* Set counter = 0, will be update to 1 when generating Poly1305 key */
    ret = mbedtls_chacha20_starts( &ctx->chacha20_ctx, nonce, 0U );
    if( ret != 0 )
        goto cleanup;

    /* Generate the Poly1305 key by getting the ChaCha20 keystream output with
     * counter = 0.  This is the same as encrypting a buffer of zeroes.
     * Only the first 256-bits (32 bytes) of the key is used for Poly1305.
     * The other 256 bits are discarded.
     */
    memset( poly1305_key, 0, sizeof( poly1305_key ) );
    ret = mbedtls_chacha20_update( &ctx->chacha20_ctx, sizeof( poly1305_key ),
                                      poly1305_key, poly1305_key );
    if( ret != 0 )
        goto cleanup;

    ret = mbedtls_poly1305_starts( &ctx->poly1305_ctx, poly1305_key );

    if( ret == 0 )
    {
        ctx->aad_len        = 0U;
        ctx->ciphertext_len = 0U;
        ctx->state          = CHACHAPOLY_STATE_AAD;
        ctx->mode           = mode;
    }

cleanup:
    mbedtls_platform_zeroize( poly1305_key, 64U );
    return( ret );
}